

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  pair<double,_double> pVar2;
  double local_38;
  pair<double,_double> p;
  double dStack_20;
  int i;
  double s2;
  double s1;
  
  s2 = 0.0;
  dStack_20 = 0.0;
  for (p.second._4_4_ = 0; p.second._4_4_ != 100; p.second._4_4_ = p.second._4_4_ + 1) {
    pVar2 = runBenchmark();
    local_38 = pVar2.first;
    s2 = local_38 + s2;
    p.first = pVar2.second;
    dStack_20 = p.first + dStack_20;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Close togeher: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s2 / 100.0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Far apart: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_20 / 100.0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  double s1 = 0;
  double s2 = 0;
  for (int i = 0; i != ITERATIONS; ++i) {
    auto p = runBenchmark();
    s1 += p.first;
    s2 += p.second;
  }
  s1 = s1 / ITERATIONS;
  s2 = s2 / ITERATIONS;
  std::cout << "Close togeher: " << s1 << std::endl;
  std::cout << "Far apart: " << s2 << std::endl;
}